

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::TextureUploadCase::init(TextureUploadCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  code *pcVar2;
  int rowPitch;
  TextureFormat *format;
  bool bVar3;
  int iVar4;
  int extraout_EAX;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  TestError *this_01;
  reference pvVar8;
  Vector<float,_4> local_1c0;
  Vector<float,_4> local_1b0;
  undefined1 local_1a0 [8];
  PixelBufferAccess access;
  int stride;
  int pixelSize;
  TextureFormat *local_168;
  TextureFormat *texFmt;
  undefined4 local_158;
  deUint32 aPos;
  deUint32 uSampler;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string fragmentShaderSource;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string vertexShaderSource;
  int maxTextureSize;
  Functions *gl;
  TextureUploadCase *this_local;
  long lVar7;
  
  pRVar6 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar7 + 0x868))(0xd33,(undefined1 *)((long)&vertexShaderSource.field_2 + 0xc));
  if ((int)vertexShaderSource.field_2._12_4_ < this->m_texSize) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Unsupported texture size");
    iVar4 = extraout_EAX;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"",&local_41);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"",&local_79);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::append(local_40);
    std::__cxx11::string::append(local_78);
    this_00 = (ShaderProgram *)operator_new(0xd0);
    aPos._3_1_ = 1;
    pRVar6 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
    glu::makeVtxFragSources((ProgramSources *)&uSampler,(string *)local_40,(string *)local_78);
    glu::ShaderProgram::ShaderProgram(this_00,pRVar6,(ProgramSources *)&uSampler);
    aPos._3_1_ = 0;
    this->m_program = this_00;
    glu::ProgramSources::~ProgramSources((ProgramSources *)&uSampler);
    bVar3 = glu::ShaderProgram::isOk(this->m_program);
    if (!bVar3) {
      glu::operator<<(this->m_log,this->m_program);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Failed to create shader program (m_programRender)",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pTextureUploadTests.cpp"
                 ,0xb6);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pcVar2 = *(code **)(lVar7 + 0x1680);
    dVar5 = glu::ShaderProgram::getProgram(this->m_program);
    (*pcVar2)(dVar5);
    (**(code **)(lVar7 + 0x1a00))(0,0,0x40);
    (**(code **)(lVar7 + 0x4e8))(0xb71);
    (**(code **)(lVar7 + 0x4e8))(0xb44);
    (**(code **)(lVar7 + 0x5e0))(0xbe2);
    (**(code **)(lVar7 + 0x120))(1);
    (**(code **)(lVar7 + 0x1c0))(0,0);
    (**(code **)(lVar7 + 0x188))(0x4000);
    pcVar2 = *(code **)(lVar7 + 0xb48);
    dVar5 = glu::ShaderProgram::getProgram(this->m_program);
    local_158 = (*pcVar2)(dVar5,"u_sampler");
    pcVar2 = *(code **)(lVar7 + 0x780);
    dVar5 = glu::ShaderProgram::getProgram(this->m_program);
    texFmt._4_4_ = (*pcVar2)(dVar5,"a_pos");
    (**(code **)(lVar7 + 0x610))(texFmt._4_4_);
    (**(code **)(lVar7 + 0x19f0))(texFmt._4_4_,2,0x1406,0,0,quadCoords);
    (**(code **)(lVar7 + 0x14f0))(local_158,0);
    (**(code **)(lVar7 + 8))(0x84c0);
    (**(code **)(lVar7 + 0x6f8))(1,&this->m_texture);
    (**(code **)(lVar7 + 0xb8))(0xde1,this->m_texture);
    (**(code **)(lVar7 + 0xff0))(0xcf5,this->m_alignment);
    (**(code **)(lVar7 + 0x1360))(0xde1,0x2802,0x812f);
    (**(code **)(lVar7 + 0x1360))(0xde1,0x2803,0x812f);
    (**(code **)(lVar7 + 0x1360))(0xde1,0x2801,0x2601);
    (**(code **)(lVar7 + 0x1360))(0xde1,0x2800,0x2601);
    _stride = glu::mapGLTransferFormat(this->m_format,this->m_type);
    local_168 = (TextureFormat *)&stride;
    access.super_ConstPixelBufferAccess.m_data._4_4_ = tcu::TextureFormat::getPixelSize(local_168);
    access.super_ConstPixelBufferAccess.m_data._0_4_ =
         deAlign32(access.super_ConstPixelBufferAccess.m_data._4_4_ * this->m_texSize,
                   this->m_alignment);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_texData,
               (long)((deInt32)access.super_ConstPixelBufferAccess.m_data * this->m_texSize));
    format = local_168;
    rowPitch = (deInt32)access.super_ConstPixelBufferAccess.m_data;
    iVar4 = this->m_texSize;
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_texData,0);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1a0,format,iVar4,iVar4,1,rowPitch,0,pvVar8);
    tcu::Vector<float,_4>::Vector(&local_1b0,0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector(&local_1c0,1.0,1.0,1.0,1.0);
    tcu::fillWithComponentGradients((PixelBufferAccess *)local_1a0,&local_1b0,&local_1c0);
    pcVar2 = *(code **)(lVar7 + 0x1310);
    iVar4 = this->m_texSize;
    dVar5 = this->m_format;
    dVar1 = this->m_type;
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_texData,0);
    (*pcVar2)(0xde1,0,dVar5,iVar4,iVar4,0,dVar5,dVar1,pvVar8);
    (**(code **)(lVar7 + 0x538))(5,0,4);
    (**(code **)(lVar7 + 0x648))();
    std::__cxx11::string::~string((string *)local_78);
    iVar4 = std::__cxx11::string::~string((string *)local_40);
  }
  return iVar4;
}

Assistant:

void TextureUploadCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	int maxTextureSize;
	gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);

	if (m_texSize > maxTextureSize)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Unsupported texture size");
		return;
	}

	// Create program

	string vertexShaderSource = "";
	string fragmentShaderSource = "";

	vertexShaderSource.append(	"precision mediump	float;\n"
								"attribute vec2		a_pos;\n"
								"varying   vec2		v_texCoord;\n"
								"\n"
								"void main (void)\n"
								"{\n"
								"	v_texCoord	= a_pos;\n"
								"	gl_Position = vec4(a_pos, 0.5, 1.0);\n"
								"}\n");

	fragmentShaderSource.append("precision	mediump	float;\n"
								"uniform	lowp sampler2D	u_sampler;\n"
								"varying	vec2			v_texCoord;\n"
								"\n"
								"void main (void)\n"
								"{\n"
								"	gl_FragColor = texture2D(u_sampler, v_texCoord.xy);\n"
								"}\n");

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));

	if (!m_program->isOk())
	{
		m_log << *m_program;
		TCU_FAIL("Failed to create shader program (m_programRender)");
	}

	gl.useProgram (m_program->getProgram());

	// Init GL state

	gl.viewport		(0, 0, VIEWPORT_SIZE, VIEWPORT_SIZE);
	gl.disable		(GL_DEPTH_TEST);
	gl.disable		(GL_CULL_FACE);
	gl.enable		(GL_BLEND);
	gl.blendFunc	(GL_ONE, GL_ONE);
	gl.clearColor	(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear		(GL_COLOR_BUFFER_BIT);

	deUint32 uSampler	= gl.getUniformLocation(m_program->getProgram(), "u_sampler");
	deUint32 aPos		= gl.getAttribLocation (m_program->getProgram(), "a_pos");
	gl.enableVertexAttribArray	(aPos);
	gl.vertexAttribPointer		(aPos,	2, GL_FLOAT, GL_FALSE, 0, &quadCoords[0]);
	gl.uniform1i				(uSampler, 0);

	// Create texture

	gl.activeTexture	(GL_TEXTURE0);
	gl.genTextures		(1, &m_texture);
	gl.bindTexture		(GL_TEXTURE_2D, m_texture);
	gl.pixelStorei		(GL_UNPACK_ALIGNMENT, m_alignment);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

	// Prepare texture data

	{
		const tcu::TextureFormat&	texFmt		= glu::mapGLTransferFormat(m_format, m_type);
		int							pixelSize	= texFmt.getPixelSize();
		int							stride		= deAlign32(pixelSize*m_texSize, m_alignment);

		m_texData.resize(stride*m_texSize);

		tcu::PixelBufferAccess		access		(texFmt, m_texSize, m_texSize, 1, stride, 0, &m_texData[0]);

		tcu::fillWithComponentGradients(access, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	}

	// Do a dry-run to ensure the pipes are hot

	gl.texImage2D	(GL_TEXTURE_2D, 0, m_format, m_texSize, m_texSize, 0, m_format, m_type, &m_texData[0]);
	gl.drawArrays	(GL_TRIANGLE_STRIP, 0, 4);
	gl.finish		();
}